

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wildmidi_lib.cpp
# Opt level: O3

int * WM_Mix(midi *handle,int *buffer,unsigned_long count)

{
  double (*padVar1) [58];
  short sVar2;
  uint uVar3;
  _note *p_Var4;
  uint uVar5;
  uint uVar6;
  double *pdVar7;
  _note *p_Var8;
  long lVar9;
  _sample *p_Var10;
  _note *p_Var11;
  _note *p_Var12;
  byte bVar13;
  byte bVar14;
  ulong uVar15;
  _note **pp_Var16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  double (*padVar20) [58];
  int iVar21;
  int iVar22;
  ulong uVar23;
  short *psVar24;
  uint uVar25;
  int iVar26;
  long lVar27;
  double *pdVar28;
  long lVar29;
  _note **pp_Var30;
  double dVar31;
  double dVar32;
  double dVar33;
  int iVar34;
  int iVar36;
  double dVar35;
  double z [35];
  double adStack_148 [35];
  
  if ((*(byte *)((long)handle + 0x30) & 2) == 0) {
    pp_Var30 = (_note **)((long)handle + 0x348);
    do {
      p_Var8 = *pp_Var30;
      iVar34 = 0;
      iVar36 = 0;
      while (p_Var8 != (_note *)0x0) {
        uVar6 = p_Var8->sample_pos;
        p_Var10 = p_Var8->sample;
        iVar21 = (int)p_Var10->data[uVar6 >> 10];
        iVar17 = (uVar6 & 0x3ff) * (p_Var10->data[(ulong)(uVar6 >> 10) + 1] - iVar21);
        iVar26 = iVar17 + 0x3ff;
        if (-1 < iVar17) {
          iVar26 = iVar17;
        }
        iVar17 = (p_Var8->env_level >> 0xc) * ((iVar26 >> 10) + iVar21);
        iVar26 = iVar17 + 0x3ff;
        if (-1 < iVar17) {
          iVar26 = iVar17;
        }
        uVar6 = uVar6 + p_Var8->sample_inc;
        uVar23._0_4_ = p_Var8->left_mix_volume;
        uVar23._4_4_ = p_Var8->right_mix_volume;
        p_Var8->sample_pos = uVar6;
        bVar14 = p_Var8->modes;
        if ((bVar14 & 4) == 0) {
          if (uVar6 < p_Var10->data_length) goto LAB_0036b731;
          goto switchD_0036b77b_caseD_6;
        }
        if (p_Var10->loop_end < uVar6) {
          p_Var8->sample_pos =
               (uVar6 - p_Var10->loop_start) % p_Var10->loop_size + p_Var10->loop_start;
        }
LAB_0036b731:
        iVar17 = p_Var8->env_inc;
        if (iVar17 == 0) goto LAB_0036b836;
        iVar22 = p_Var8->env_level + iVar17;
        p_Var8->env_level = iVar22;
        bVar13 = p_Var8->env;
        iVar21 = p_Var10->env_target[bVar13];
        if (iVar17 < 0) {
          if (iVar22 <= iVar21) goto LAB_0036b767;
          goto LAB_0036b836;
        }
        if (iVar22 < iVar21) goto LAB_0036b836;
LAB_0036b767:
        p_Var8->env_level = iVar21;
        switch(bVar13) {
        case 0:
          if ((bVar14 & 0x40) == 0) {
LAB_0036b82d:
            p_Var8->env_inc = 0;
            goto LAB_0036b836;
          }
        default:
switchD_0036b77b_caseD_1:
          bVar13 = bVar13 + 1;
          p_Var8->env = bVar13;
          if (p_Var8->is_off == '\x01') {
            do_note_off_extra(p_Var8);
            iVar21 = p_Var8->env_level;
            p_Var10 = p_Var8->sample;
            bVar13 = p_Var8->env;
          }
          iVar17 = -p_Var10->env_rate[bVar13];
          if (iVar21 <= p_Var10->env_target[bVar13]) {
            iVar17 = p_Var10->env_rate[bVar13];
          }
          p_Var8->env_inc = iVar17;
LAB_0036b836:
          p_Var8 = p_Var8->next;
          break;
        case 2:
          if ((bVar14 & 0x20) != 0) goto LAB_0036b82d;
          if (-1 < (char)bVar14) goto switchD_0036b77b_caseD_1;
          p_Var8->env = '\x05';
          iVar17 = -p_Var10->env_rate[5];
          if (iVar21 <= p_Var10->env_target[5]) {
            iVar17 = p_Var10->env_rate[5];
          }
          p_Var8->env_inc = iVar17;
          break;
        case 5:
          if (iVar21 != 0) {
            if ((bVar14 & 4) != 0) {
              p_Var8->modes = bVar14 & 0xfb;
            }
            goto LAB_0036b82d;
          }
        case 6:
switchD_0036b77b_caseD_6:
          p_Var12 = p_Var8->replay;
          p_Var8->active = '\0';
          p_Var4 = *pp_Var30;
          if (p_Var12 == (_note *)0x0) {
            if (p_Var4 == p_Var8) {
              p_Var8 = p_Var8->next;
              *pp_Var30 = p_Var8;
            }
            else {
              do {
                p_Var12 = p_Var4;
                p_Var4 = p_Var12->next;
                if (p_Var4 == p_Var8) break;
              } while (p_Var4 != (_note *)0x0);
              p_Var8 = p_Var8->next;
              p_Var12->next = p_Var8;
            }
          }
          else {
            pp_Var16 = pp_Var30;
            if (p_Var4 != p_Var8) {
              do {
                p_Var11 = p_Var4;
                p_Var4 = p_Var11->next;
              } while (p_Var4 != p_Var8);
              pp_Var16 = &p_Var11->next;
            }
            *pp_Var16 = p_Var12;
            p_Var12->next = p_Var8->next;
            p_Var12->active = '\x01';
            p_Var8 = p_Var12;
          }
        }
        iVar17 = (int)((uVar23 >> 0x20) * (ulong)(uint)(iVar26 >> 10));
        iVar26 = (int)((ulong)(uint)(iVar26 >> 10) * (uVar23 & 0xffffffff));
        iVar34 = iVar34 + ((int)(((uint)(iVar26 >> 0x1f) >> 0x16) + iVar26) >> 10);
        iVar36 = iVar36 + ((int)(((uint)(iVar17 >> 0x1f) >> 0x16) + iVar17) >> 10);
      }
      *buffer = iVar34;
      buffer[1] = iVar36;
      buffer = buffer + 2;
      count = count - 1;
    } while (count != 0);
  }
  else {
    if (gauss_table == (double *)0x0) {
      FCriticalSection::Enter(&gauss_lock);
      pdVar7 = gauss_table;
      if (gauss_table == (double *)0x0) {
        newt_coeffs[0][0] = 1.0;
        uVar15 = 0;
        padVar20 = newt_coeffs;
        do {
          padVar1 = newt_coeffs + uVar15;
          newt_coeffs[uVar15][0] = 1.0;
          (*padVar1)[uVar15] = 1.0;
          if (1 < uVar15) {
            dVar33 = 1.0 / (double)(int)uVar15;
            dVar35 = *(double *)((long)&fluid_chorus_type + uVar15 * 0x1d0 + 8) * dVar33;
            (*padVar1)[0] = dVar35;
            (*padVar1)[uVar15] = dVar35;
            uVar23 = 1;
            dVar35 = *(double *)((long)&fluid_chorus_type + uVar15 * 0x1d0 + 8);
            do {
              pdVar7 = padVar20[-1] + uVar23;
              (*padVar20)[uVar23] = (dVar35 + *pdVar7) * dVar33;
              uVar23 = uVar23 + 1;
              dVar35 = *pdVar7;
            } while (uVar15 != uVar23);
          }
          adStack_148[uVar15] = (double)(int)uVar15 * 0.07957747154594767;
          uVar15 = uVar15 + 1;
          padVar20 = padVar20 + 1;
        } while (uVar15 != 0x23);
        lVar29 = 1;
        padVar20 = newt_coeffs;
        uVar15 = 0;
        do {
          dVar35 = (double)__powidf2(0xbff0000000000000,uVar15 & 0xffffffff);
          iVar34 = (int)dVar35;
          lVar9 = 0;
          do {
            (*padVar20)[lVar9] = (double)iVar34 * (*padVar20)[lVar9];
            lVar9 = lVar9 + 1;
            iVar34 = -iVar34;
          } while (lVar29 != lVar9);
          uVar15 = uVar15 + 1;
          lVar29 = lVar29 + 1;
          padVar20 = padVar20 + 1;
        } while (uVar15 != 0x23);
        pdVar7 = (double *)malloc(0x46000);
        dVar35 = 0.0;
        lVar29 = 0;
        do {
          pdVar28 = pdVar7 + lVar29 * 0x23;
          lVar9 = 0;
          do {
            lVar27 = 0;
            dVar33 = 1.0;
            do {
              if (lVar9 != lVar27) {
                dVar32 = adStack_148[lVar27];
                dVar31 = sin((dVar35 * 0.07957747154594767 + 1.3528170162811104) - dVar32);
                dVar32 = sin(adStack_148[lVar9] - dVar32);
                dVar33 = (dVar31 * dVar33) / dVar32;
              }
              lVar27 = lVar27 + 1;
            } while (lVar27 != 0x23);
            *pdVar28 = dVar33;
            pdVar28 = pdVar28 + 1;
            lVar9 = lVar9 + 1;
          } while (lVar9 != 0x23);
          lVar29 = lVar29 + 1;
          dVar35 = dVar35 + 0.0009765625;
        } while (lVar29 != 0x400);
      }
      gauss_table = pdVar7;
      FCriticalSection::Leave(&gauss_lock);
    }
    pp_Var30 = (_note **)((long)handle + 0x348);
    do {
      p_Var8 = *pp_Var30;
      iVar34 = 0;
      iVar36 = 0;
      while (p_Var8 != (_note *)0x0) {
        uVar6 = p_Var8->sample_pos;
        uVar25 = uVar6 >> 10;
        p_Var10 = p_Var8->sample;
        uVar3 = p_Var10->data_length;
        uVar5 = (~uVar25 + (uVar3 >> 10)) * 2;
        if ((int)uVar5 < 3) {
          uVar5 = 2;
        }
        uVar18 = uVar6 >> 9 | 1;
        if (uVar5 - 1 < uVar18) {
          uVar18 = uVar5 - 1;
        }
        if (uVar18 < 0x22) {
          uVar19 = uVar18 + 1;
          uVar23 = (ulong)(uVar25 * 2) + 1;
          uVar15 = (ulong)uVar5 - 1;
          if (uVar23 < (ulong)uVar5 - 1) {
            uVar15 = uVar23;
          }
          psVar24 = (short *)((long)p_Var10->data +
                             (long)(int)-(uVar18 >> 1) * 2 + (ulong)(uVar25 * 2));
          padVar20 = newt_coeffs + uVar15;
          dVar35 = 0.0;
          do {
            if (-1 < (long)uVar15) {
              uVar23 = 0;
              do {
                dVar35 = dVar35 + (double)(int)psVar24[uVar23] * (*padVar20)[uVar23];
                uVar23 = uVar23 + 1;
              } while (uVar19 != uVar23);
            }
            iVar26 = (int)uVar15 + -1;
            dVar35 = (((double)(uVar18 >> 1) + (double)(uVar6 & 0x3ff) * 0.0009765625) -
                     (double)iVar26) * dVar35;
            uVar19 = uVar19 - 1;
            uVar15 = uVar15 - 1;
            padVar20 = padVar20 + -1;
          } while (iVar26 != 0);
          dVar35 = dVar35 + (double)(int)*psVar24;
        }
        else {
          psVar24 = p_Var10->data + ((ulong)uVar25 - 0x11);
          dVar35 = 0.0;
          uVar15 = 0xfffffffffffffff8;
          do {
            sVar2 = *psVar24;
            psVar24 = psVar24 + 1;
            dVar35 = dVar35 + (double)(int)sVar2 *
                              *(double *)
                               ((long)gauss_table + uVar15 + (ulong)((uVar6 & 0x3ff) * 0x118) + 8);
            uVar15 = uVar15 + 8;
          } while (uVar15 < 0x109);
        }
        iVar26 = p_Var8->env_level;
        uVar6 = uVar6 + p_Var8->sample_inc;
        uVar15._0_4_ = p_Var8->left_mix_volume;
        uVar15._4_4_ = p_Var8->right_mix_volume;
        p_Var8->sample_pos = uVar6;
        if (p_Var10->loop_end < uVar6) {
          if ((p_Var8->modes & 4) != 0) {
            p_Var8->sample_pos =
                 (uVar6 - p_Var10->loop_start) % p_Var10->loop_size + p_Var10->loop_start;
            goto LAB_0036bcca;
          }
          if (uVar6 < uVar3) goto LAB_0036bcca;
          goto switchD_0036bd19_caseD_6;
        }
LAB_0036bcca:
        iVar17 = p_Var8->env_inc;
        if (iVar17 == 0) goto LAB_0036bdc8;
        iVar21 = iVar17 + iVar26;
        p_Var8->env_level = iVar21;
        bVar14 = p_Var8->env;
        iVar22 = p_Var10->env_target[bVar14];
        if (iVar17 < 0) {
          if (iVar21 <= iVar22) goto LAB_0036bcff;
          goto LAB_0036bdc8;
        }
        if (iVar21 < iVar22) goto LAB_0036bdc8;
LAB_0036bcff:
        p_Var8->env_level = iVar22;
        switch(bVar14) {
        case 0:
          if ((p_Var8->modes & 0x40) == 0) {
LAB_0036bdbf:
            p_Var8->env_inc = 0;
            goto LAB_0036bdc8;
          }
        default:
switchD_0036bd19_caseD_1:
          bVar14 = bVar14 + 1;
          p_Var8->env = bVar14;
          if (p_Var8->is_off == '\x01') {
            do_note_off_extra(p_Var8);
            iVar22 = p_Var8->env_level;
            p_Var10 = p_Var8->sample;
            bVar14 = p_Var8->env;
          }
          iVar17 = -p_Var10->env_rate[bVar14];
          if (iVar22 <= p_Var10->env_target[bVar14]) {
            iVar17 = p_Var10->env_rate[bVar14];
          }
          p_Var8->env_inc = iVar17;
LAB_0036bdc8:
          p_Var8 = p_Var8->next;
          break;
        case 2:
          if ((p_Var8->modes & 0x20) != 0) goto LAB_0036bdbf;
          if (-1 < (char)p_Var8->modes) goto switchD_0036bd19_caseD_1;
          p_Var8->env = '\x05';
          iVar17 = -p_Var10->env_rate[5];
          if (iVar22 <= p_Var10->env_target[5]) {
            iVar17 = p_Var10->env_rate[5];
          }
          p_Var8->env_inc = iVar17;
          break;
        case 5:
          if (iVar22 != 0) {
            if ((p_Var8->modes & 4) != 0) {
              p_Var8->modes = p_Var8->modes & 0xfb;
            }
            goto LAB_0036bdbf;
          }
        case 6:
switchD_0036bd19_caseD_6:
          p_Var12 = p_Var8->replay;
          p_Var8->active = '\0';
          p_Var4 = *pp_Var30;
          if (p_Var12 == (_note *)0x0) {
            if (p_Var4 == p_Var8) {
              p_Var8 = p_Var8->next;
              *pp_Var30 = p_Var8;
            }
            else {
              do {
                p_Var12 = p_Var4;
                p_Var4 = p_Var12->next;
                if (p_Var4 == p_Var8) break;
              } while (p_Var4 != (_note *)0x0);
              p_Var8 = p_Var8->next;
              p_Var12->next = p_Var8;
            }
          }
          else {
            pp_Var16 = pp_Var30;
            if (p_Var4 != p_Var8) {
              do {
                p_Var11 = p_Var4;
                p_Var4 = p_Var11->next;
              } while (p_Var4 != p_Var8);
              pp_Var16 = &p_Var11->next;
            }
            *pp_Var16 = p_Var12;
            p_Var12->next = p_Var8->next;
            p_Var12->active = '\x01';
            p_Var8 = p_Var12;
          }
        }
        uVar6 = (uint)(dVar35 * 0.0009765625 * (double)(iVar26 >> 0xc));
        iVar26 = (int)((uVar15 >> 0x20) * (ulong)uVar6);
        iVar17 = (int)((uVar15 & 0xffffffff) * (ulong)uVar6);
        iVar34 = iVar34 + ((int)(((uint)(iVar17 >> 0x1f) >> 0x16) + iVar17) >> 10);
        iVar36 = iVar36 + ((int)(((uint)(iVar26 >> 0x1f) >> 0x16) + iVar26) >> 10);
      }
      *buffer = iVar34;
      buffer[1] = iVar36;
      buffer = buffer + 2;
      count = count - 1;
    } while (count != 0);
  }
  return buffer;
}

Assistant:

int *WM_Mix(midi *handle, int *buffer, unsigned long count)
{
	if (((struct _mdi *)handle)->info.mixer_options & WM_MO_ENHANCED_RESAMPLING)
	{
		return WM_Mix_Gauss(handle, buffer, count);
	}
	else
	{
		return WM_Mix_Linear(handle, buffer, count);
	}
}